

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.hpp
# Opt level: O0

iterator * __thiscall
first_fit_heap<128UL>::free_list_container::iterator::operator++(iterator *this)

{
  bool bVar1;
  header_free *phVar2;
  exception *this_00;
  iterator *this_local;
  
  phVar2 = header_free::next(this->block);
  this->block = phVar2;
  if ((this->block != (header_free *)0x0) &&
     (bVar1 = header_used::canary_alive(&this->block->super_header_used), !bVar1)) {
    this_00 = (exception *)__cxa_allocate_exception(8);
    std::exception::exception(this_00);
    __cxa_throw(this_00,&std::exception::typeinfo,std::exception::~exception);
  }
  return this;
}

Assistant:

iterator &operator++()
            {
                block = block->next();
                ASSERT_HEAP(block ? block->canary_alive() : true);
                return *this;
            }